

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

Worker * __thiscall Worker::ReplaceRNUMEx(Worker *this,string *in)

{
  uint uVar1;
  result_type rVar2;
  char *__nptr;
  string *in_RDX;
  __cxx11 local_1458 [32];
  string local_1438 [8];
  string to;
  string local_1418 [36];
  uint local_13f4;
  long lStack_13f0;
  int m;
  size_type e_pos;
  size_type s_pos;
  allocator local_13c9;
  string local_13c8 [8];
  string from;
  undefined1 local_13a8 [8];
  random_device rd;
  string *in_local;
  Worker *this_local;
  string *subject;
  
  std::random_device::random_device((random_device *)local_13a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c8,"$RNUM(",&local_13c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c9);
  s_pos._3_1_ = 0;
  std::__cxx11::string::string((string *)this,in_RDX);
  e_pos = std::__cxx11::string::find((string *)this,(ulong)local_13c8);
  while (e_pos != 0xffffffffffffffff) {
    lStack_13f0 = std::__cxx11::string::find((char *)this,0x112401);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_1418,(ulong)this);
    __nptr = (char *)std::__cxx11::string::c_str();
    uVar1 = atoi(__nptr);
    std::__cxx11::string::~string(local_1418);
    local_13f4 = uVar1;
    std::__cxx11::string::string(local_1438);
    if ((int)local_13f4 < 1) {
      std::__cxx11::string::operator=(local_1438,"");
    }
    else {
      rVar2 = std::random_device::operator()((random_device *)local_13a8);
      std::__cxx11::to_string(local_1458,rVar2 % local_13f4);
      std::__cxx11::string::operator=(local_1438,(string *)local_1458);
      std::__cxx11::string::~string((string *)local_1458);
    }
    std::__cxx11::string::replace((ulong)this,e_pos,(string *)((lStack_13f0 - e_pos) + 1));
    std::__cxx11::string::size();
    e_pos = std::__cxx11::string::find((string *)this,(ulong)local_13c8);
    std::__cxx11::string::~string(local_1438);
  }
  s_pos._3_1_ = 1;
  std::__cxx11::string::~string(local_13c8);
  std::random_device::~random_device((random_device *)local_13a8);
  return this;
}

Assistant:

string Worker::ReplaceRNUMEx(const string in) {
    random_device rd;

    string from = "$RNUM(";
    string subject = in;
    string::size_type s_pos = subject.find(from);

    while (s_pos != string::npos) {
        string::size_type e_pos = subject.find(")", s_pos);
        int m = atoi(subject.substr(s_pos + from.size(), e_pos).c_str());
        string to;
        if (m > 0) {
            to = to_string(rd() % m);
        }else{
            to = "";
        }
        subject.replace(s_pos, e_pos - s_pos +1, to);
        s_pos = subject.find(from, s_pos + to.size());
    }

    return subject;
}